

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O2

ze_result_t zeGetMemProcAddrTable(ze_api_version_t version,ze_mem_dditable_t *pDdiTable)

{
  ze_result_t zVar1;
  
  if (pDdiTable != (ze_mem_dditable_t *)0x0) {
    zVar1 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if ((int)version <= driver::context) {
      pDdiTable->pfnAllocShared = driver::zeMemAllocShared;
      pDdiTable->pfnAllocDevice = driver::zeMemAllocDevice;
      pDdiTable->pfnAllocHost = driver::zeMemAllocHost;
      pDdiTable->pfnFree = driver::zeMemFree;
      pDdiTable->pfnGetAllocProperties = driver::zeMemGetAllocProperties;
      pDdiTable->pfnGetAddressRange = driver::zeMemGetAddressRange;
      pDdiTable->pfnGetIpcHandle = driver::zeMemGetIpcHandle;
      pDdiTable->pfnOpenIpcHandle = driver::zeMemOpenIpcHandle;
      pDdiTable->pfnCloseIpcHandle = driver::zeMemCloseIpcHandle;
      pDdiTable->pfnFreeExt = driver::zeMemFreeExt;
      pDdiTable->pfnPutIpcHandle = driver::zeMemPutIpcHandle;
      pDdiTable->pfnGetPitchFor2dImage = driver::zeMemGetPitchFor2dImage;
      zVar1 = ZE_RESULT_SUCCESS;
    }
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetMemProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_mem_dditable_t* pDdiTable                    ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( driver::context.version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    pDdiTable->pfnAllocShared                            = driver::zeMemAllocShared;

    pDdiTable->pfnAllocDevice                            = driver::zeMemAllocDevice;

    pDdiTable->pfnAllocHost                              = driver::zeMemAllocHost;

    pDdiTable->pfnFree                                   = driver::zeMemFree;

    pDdiTable->pfnGetAllocProperties                     = driver::zeMemGetAllocProperties;

    pDdiTable->pfnGetAddressRange                        = driver::zeMemGetAddressRange;

    pDdiTable->pfnGetIpcHandle                           = driver::zeMemGetIpcHandle;

    pDdiTable->pfnOpenIpcHandle                          = driver::zeMemOpenIpcHandle;

    pDdiTable->pfnCloseIpcHandle                         = driver::zeMemCloseIpcHandle;

    pDdiTable->pfnFreeExt                                = driver::zeMemFreeExt;

    pDdiTable->pfnPutIpcHandle                           = driver::zeMemPutIpcHandle;

    pDdiTable->pfnGetPitchFor2dImage                     = driver::zeMemGetPitchFor2dImage;

    return result;
}